

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::PrintFieldDescriptor
          (Generator *this,FieldDescriptor *field,bool is_extension)

{
  code *buffer;
  float value;
  double value_00;
  FieldDescriptor FVar1;
  long lVar2;
  long lVar3;
  mapped_type *pmVar4;
  long *plVar5;
  undefined8 *puVar6;
  EnumValueDescriptor *pEVar7;
  LogMessage *other;
  code *pcVar8;
  long *plVar9;
  undefined7 in_register_00000011;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  protobuf *this_00;
  char *pcVar11;
  char *pcVar12;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  string options_string;
  char field_descriptor_decl [455];
  key_type local_2b0;
  undefined1 local_290 [36];
  undefined4 local_26c;
  Generator *local_268;
  FieldDescriptor *local_260;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_258;
  string local_228;
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [28];
  FieldDescriptor *local_38;
  
  local_26c = (undefined4)CONCAT71(in_register_00000011,is_extension);
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  local_228._M_string_length = 0;
  local_228.field_2._M_local_buf[0] = '\0';
  local_268 = this;
  MessageLite::SerializeToString(*(MessageLite **)(field + 0x38),&local_228);
  local_258._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_258._M_impl.super__Rb_tree_header._M_header;
  local_258._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_258._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_258._M_impl.super__Rb_tree_header._M_node_count = 0;
  buffer = (code *)(local_208 + 0x10);
  local_258._M_impl.super__Rb_tree_header._M_header._M_right =
       local_258._M_impl.super__Rb_tree_header._M_header._M_left;
  local_208._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_258,(key_type *)local_208);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((code *)local_208._0_8_ != buffer) {
    operator_delete((void *)local_208._0_8_);
  }
  local_208._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"full_name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_258,(key_type *)local_208);
  std::__cxx11::string::_M_assign((string *)pmVar4);
  if ((code *)local_208._0_8_ != buffer) {
    operator_delete((void *)local_208._0_8_);
  }
  if (((byte)field[1] & 8) == 0) {
    plVar5 = (long *)(*(long *)(field + 0x20) + 0x28);
  }
  else if (*(long *)(field + 0x28) == 0) {
    plVar5 = (long *)(*(long *)(field + 0x10) + 0x70);
  }
  else {
    plVar5 = (long *)(*(long *)(field + 0x28) + 0x50);
  }
  local_208._0_8_ = buffer;
  local_208._8_8_ =
       FastInt32ToBufferLeft((int)((ulong)((long)field - *plVar5) >> 3) * 0x38e38e39,(char *)buffer)
  ;
  local_208._8_8_ = local_208._8_8_ + -(long)buffer;
  local_290._0_8_ = local_290 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,local_208._0_8_,(char *)(local_208._8_8_ + local_208._0_8_));
  paVar10 = &local_2b0.field_2;
  local_2b0._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"index","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_258,&local_2b0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_);
  }
  local_208._0_8_ = buffer;
  local_208._8_8_ = FastInt32ToBufferLeft(*(int32 *)(field + 4),(char *)buffer);
  local_208._8_8_ = local_208._8_8_ + -(long)buffer;
  local_290._0_8_ = local_290 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,local_208._0_8_,(char *)(local_208._8_8_ + local_208._0_8_));
  local_2b0._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"number","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_258,&local_2b0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_);
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_2b0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_260 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_2b0,
               &local_260);
  }
  local_208._0_8_ = buffer;
  local_208._8_8_ = FastInt32ToBufferLeft((uint)(byte)field[2],(char *)buffer);
  local_208._8_8_ = local_208._8_8_ + -(long)buffer;
  local_290._0_8_ = local_290 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,local_208._0_8_,(char *)(local_208._8_8_ + local_208._0_8_));
  local_2b0._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"type","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_258,&local_2b0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_);
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_2b0._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    local_260 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_2b0,
               &local_260);
  }
  local_208._0_8_ = buffer;
  local_208._8_8_ =
       FastInt32ToBufferLeft
                 (*(int32 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4),
                  (char *)buffer);
  local_208._8_8_ = local_208._8_8_ + -(long)buffer;
  local_290._0_8_ = local_290 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,local_208._0_8_,(char *)(local_208._8_8_ + local_208._0_8_));
  local_2b0._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"cpp_type","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_258,&local_2b0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_);
  }
  local_208._0_8_ = buffer;
  local_208._8_8_ = FastInt32ToBufferLeft((byte)field[1] >> 5 & 3,(char *)buffer);
  local_208._8_8_ = local_208._8_8_ + -(long)buffer;
  local_290._0_8_ = local_290 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_290,local_208._0_8_,(char *)(local_208._8_8_ + local_208._0_8_));
  local_2b0._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"label","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_258,&local_2b0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_290);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((FieldDescriptor *)local_290._0_8_ != (FieldDescriptor *)(local_290 + 0x10)) {
    operator_delete((void *)local_290._0_8_);
  }
  pcVar11 = "False";
  pcVar12 = "False";
  if (((byte)field[1] & 1) != 0) {
    pcVar12 = "True";
  }
  local_208._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"has_default_value","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_258,(key_type *)local_208);
  this_00 = (protobuf *)0x0;
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,(ulong)pcVar12);
  if ((code *)local_208._0_8_ != buffer) {
    operator_delete((void *)local_208._0_8_);
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    local_2b0.field_2._M_local_buf[0] = '[';
    local_2b0.field_2._M_local_buf[1] = ']';
    local_2b0._M_string_length = 2;
    local_2b0.field_2._M_local_buf[2] = '\0';
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    goto LAB_0028b4e7;
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    this_00 = (protobuf *)local_208;
    local_208._0_8_ = FieldDescriptor::TypeOnceInit;
    local_290._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)this_00,
               (FieldDescriptor **)local_290);
  }
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4)) {
  case 1:
    local_208._0_8_ = buffer;
    local_208._8_8_ = FastInt32ToBufferLeft(*(int32 *)(field + 0x40),(char *)buffer);
    local_208._8_8_ = local_208._8_8_ + -(long)buffer;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,local_208._0_8_,(char *)(local_208._8_8_ + local_208._0_8_));
    break;
  case 2:
    local_208._0_8_ = buffer;
    local_208._8_8_ = FastInt64ToBufferLeft(*(int64 *)(field + 0x40),(char *)buffer);
    local_208._8_8_ = local_208._8_8_ + -(long)buffer;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,local_208._0_8_,(char *)(local_208._8_8_ + local_208._0_8_));
    break;
  case 3:
    local_208._0_8_ = buffer;
    local_208._8_8_ = FastUInt32ToBufferLeft(*(uint32 *)(field + 0x40),(char *)buffer);
    local_208._8_8_ = local_208._8_8_ + -(long)buffer;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,local_208._0_8_,(char *)(local_208._8_8_ + local_208._0_8_));
    break;
  case 4:
    local_208._0_8_ = buffer;
    local_208._8_8_ = FastUInt64ToBufferLeft(*(uint64 *)(field + 0x40),(char *)buffer);
    local_208._8_8_ = local_208._8_8_ + -(long)buffer;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,local_208._0_8_,(char *)(local_208._8_8_ + local_208._0_8_));
    break;
  case 5:
    value_00 = *(double *)(field + 0x40);
    if (INFINITY <= value_00) {
LAB_0028ba14:
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      local_2b0.field_2._M_local_buf[0] = '1';
      local_2b0.field_2._M_local_buf[1] = 'e';
      local_2b0.field_2._M_local_buf[2] = '1';
      local_2b0.field_2._M_local_buf[3] = '0';
      local_2b0.field_2._M_local_buf[4] = '0';
      local_2b0.field_2._M_allocated_capacity._5_2_ = 0x3030;
      local_2b0._M_string_length = 7;
      local_2b0.field_2._M_local_buf[7] = '\0';
      break;
    }
    if (value_00 <= -INFINITY) {
LAB_0028bb49:
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      local_2b0.field_2._M_local_buf[0] = '-';
      local_2b0.field_2._M_local_buf[1] = '1';
      local_2b0.field_2._M_local_buf[2] = 'e';
      local_2b0.field_2._M_local_buf[3] = '1';
      local_2b0.field_2._M_local_buf[4] = '0';
      local_2b0.field_2._M_allocated_capacity._5_2_ = 0x3030;
      local_2b0.field_2._M_local_buf[7] = '0';
      local_2b0._M_string_length = 8;
      local_2b0.field_2._M_local_buf[8] = '\0';
      break;
    }
    if (NAN(value_00)) {
LAB_0028bcba:
      local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
      local_2b0.field_2._M_local_buf[0] = '(';
      local_2b0.field_2._M_local_buf[1] = '1';
      local_2b0.field_2._M_local_buf[2] = 'e';
      local_2b0.field_2._M_local_buf[3] = '1';
      local_2b0.field_2._M_local_buf[4] = '0';
      local_2b0.field_2._M_allocated_capacity._5_2_ = 0x3030;
      local_2b0.field_2._M_local_buf[7] = '0';
      local_2b0.field_2._M_local_buf[8] = ' ';
      local_2b0.field_2._9_4_ = 0x2930202a;
      local_2b0._M_string_length = 0xd;
      local_2b0.field_2._M_local_buf[0xd] = '\0';
      break;
    }
    SimpleDtoa_abi_cxx11_((string *)local_290,this_00,value_00);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   "float(",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_290);
    plVar5 = (long *)std::__cxx11::string::append(local_208);
    goto LAB_0028bc48;
  case 6:
    value = *(float *)(field + 0x40);
    if (INFINITY <= value) goto LAB_0028ba14;
    if (value <= -INFINITY) goto LAB_0028bb49;
    if (NAN(value)) goto LAB_0028bcba;
    SimpleFtoa_abi_cxx11_((string *)local_290,this_00,value);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208,
                   "float(",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_290);
    plVar5 = (long *)std::__cxx11::string::append(local_208);
LAB_0028bc48:
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5;
    plVar9 = plVar5 + 2;
    if (paVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar9) {
      lVar2 = *plVar9;
      lVar3 = plVar5[3];
      local_2b0.field_2._M_local_buf[0] = (char)lVar2;
      local_2b0.field_2._M_local_buf[1] = (char)((ulong)lVar2 >> 8);
      local_2b0.field_2._M_local_buf[2] = (char)((ulong)lVar2 >> 0x10);
      local_2b0.field_2._M_local_buf[3] = (char)((ulong)lVar2 >> 0x18);
      local_2b0.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
      local_2b0.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)lVar2 >> 0x28);
      local_2b0.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
      local_2b0.field_2._M_local_buf[8] = (char)lVar3;
      local_2b0.field_2._9_4_ = (undefined4)((ulong)lVar3 >> 8);
      local_2b0.field_2._M_local_buf[0xd] = (char)((ulong)lVar3 >> 0x28);
      local_2b0.field_2._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
    }
    else {
LAB_0028bc5c:
      lVar2 = *plVar9;
      local_2b0.field_2._M_local_buf[0] = (char)lVar2;
      local_2b0.field_2._M_local_buf[1] = (char)((ulong)lVar2 >> 8);
      local_2b0.field_2._M_local_buf[2] = (char)((ulong)lVar2 >> 0x10);
      local_2b0.field_2._M_local_buf[3] = (char)((ulong)lVar2 >> 0x18);
      local_2b0.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
      local_2b0.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)lVar2 >> 0x28);
      local_2b0.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
      local_2b0._M_dataplus._M_p = (pointer)paVar10;
    }
LAB_0028bc69:
    local_2b0._M_string_length = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    if ((code *)local_208._0_8_ != buffer) {
      operator_delete((void *)local_208._0_8_);
    }
    if ((FieldDescriptor *)local_290._0_8_ != (FieldDescriptor *)(local_290 + 0x10)) {
      operator_delete((void *)local_290._0_8_);
    }
    break;
  case 7:
    pcVar12 = "False";
    if ((ulong)(byte)field[0x40] != 0) {
      pcVar12 = "True";
    }
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,pcVar12,pcVar12 + ((ulong)(byte)field[0x40] ^ 5));
    break;
  case 8:
    pEVar7 = FieldDescriptor::default_value_enum(field);
    local_208._0_8_ = buffer;
    local_208._8_8_ = FastInt32ToBufferLeft(*(int32 *)(pEVar7 + 4),(char *)buffer);
    local_208._8_8_ = local_208._8_8_ + -(long)buffer;
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0,local_208._0_8_,(char *)(local_208._8_8_ + local_208._0_8_));
    break;
  case 9:
    CEscape((string *)local_290,*(string **)(field + 0x40));
    puVar6 = (undefined8 *)std::__cxx11::string::replace((ulong)local_290,0,(char *)0x0,0x3ebe55);
    pcVar8 = (code *)(puVar6 + 2);
    if ((code *)*puVar6 == pcVar8) {
      local_1f8[0]._0_8_ = *(undefined8 *)pcVar8;
      local_1f8[0]._8_8_ = puVar6[3];
      local_208._0_8_ = buffer;
    }
    else {
      local_1f8[0]._0_8_ = *(undefined8 *)pcVar8;
      local_208._0_8_ = (code *)*puVar6;
    }
    local_208._8_8_ = puVar6[1];
    *puVar6 = pcVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_260 = (FieldDescriptor *)FieldDescriptor::TypeOnceInit;
      local_38 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_260,
                 &local_38);
    }
    plVar5 = (long *)std::__cxx11::string::append(local_208);
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar5;
    plVar9 = plVar5 + 2;
    if (paVar10 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar9) goto LAB_0028bc5c;
    lVar2 = *plVar9;
    lVar3 = plVar5[3];
    local_2b0.field_2._M_local_buf[0] = (char)lVar2;
    local_2b0.field_2._M_local_buf[1] = (char)((ulong)lVar2 >> 8);
    local_2b0.field_2._M_local_buf[2] = (char)((ulong)lVar2 >> 0x10);
    local_2b0.field_2._M_local_buf[3] = (char)((ulong)lVar2 >> 0x18);
    local_2b0.field_2._M_local_buf[4] = (char)((ulong)lVar2 >> 0x20);
    local_2b0.field_2._M_allocated_capacity._5_2_ = (undefined2)((ulong)lVar2 >> 0x28);
    local_2b0.field_2._M_local_buf[7] = (char)((ulong)lVar2 >> 0x38);
    local_2b0.field_2._M_local_buf[8] = (char)lVar3;
    local_2b0.field_2._9_4_ = (undefined4)((ulong)lVar3 >> 8);
    local_2b0.field_2._M_local_buf[0xd] = (char)((ulong)lVar3 >> 0x28);
    local_2b0.field_2._14_2_ = (undefined2)((ulong)lVar3 >> 0x30);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    goto LAB_0028bc69;
  case 10:
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    local_2b0.field_2._M_local_buf[0] = 'N';
    local_2b0.field_2._M_local_buf[1] = 'o';
    local_2b0.field_2._M_local_buf[2] = 'n';
    local_2b0.field_2._M_local_buf[3] = 'e';
    local_2b0._M_string_length = 4;
    local_2b0.field_2._M_local_buf[4] = '\0';
    break;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)local_208,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x10f);
    other = internal::LogMessage::operator<<((LogMessage *)local_208,"Not reached.");
    internal::LogFinisher::operator=((LogFinisher *)local_290,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_208);
    local_2b0._M_string_length = 0;
    local_2b0.field_2._M_local_buf[0] = '\0';
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
  }
LAB_0028b4e7:
  local_208._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"default_value","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_258,(key_type *)local_208);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_2b0);
  paVar10 = &local_2b0.field_2;
  if ((code *)local_208._0_8_ != buffer) {
    operator_delete((void *)local_208._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((char)local_26c != '\0') {
    pcVar11 = "True";
  }
  local_208._0_8_ = buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"is_extension","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_258,(key_type *)local_208);
  std::__cxx11::string::_M_replace((ulong)pmVar4,0,(char *)pmVar4->_M_string_length,(ulong)pcVar11);
  if ((code *)local_208._0_8_ != buffer) {
    operator_delete((void *)local_208._0_8_);
  }
  OptionsValue((string *)local_208,local_268,&local_228);
  local_290._0_8_ = local_290 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"serialized_options","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_258,(key_type *)local_290);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_208);
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_);
  }
  if ((code *)local_208._0_8_ != buffer) {
    operator_delete((void *)local_208._0_8_);
  }
  FVar1 = field[1];
  if (((byte)FVar1 & 4) == 0) {
    local_208._0_8_ = buffer;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"");
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                   ", json_name=\'",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((ulong)(((byte)field[3] & 0x70) * 2) + *(long *)(field + 8)));
    puVar6 = (undefined8 *)std::__cxx11::string::append(local_290);
    pcVar8 = (code *)(puVar6 + 2);
    if ((code *)*puVar6 == pcVar8) {
      local_1f8[0]._0_8_ = *(undefined8 *)pcVar8;
      local_1f8[0]._8_8_ = puVar6[3];
      local_208._0_8_ = buffer;
    }
    else {
      local_1f8[0]._0_8_ = *(undefined8 *)pcVar8;
      local_208._0_8_ = (code *)*puVar6;
    }
    local_208._8_8_ = puVar6[1];
    *puVar6 = pcVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
  }
  local_2b0._M_dataplus._M_p = (pointer)paVar10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"json_name","");
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_258,&local_2b0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b0._M_dataplus._M_p != paVar10) {
    operator_delete(local_2b0._M_dataplus._M_p);
  }
  if ((code *)local_208._0_8_ != buffer) {
    operator_delete((void *)local_208._0_8_);
  }
  if ((((byte)FVar1 & 4) != 0) && ((undefined1 *)local_290._0_8_ != local_290 + 0x10)) {
    operator_delete((void *)local_290._0_8_);
  }
  memcpy(local_208,
         "_descriptor.FieldDescriptor(\n  name=\'$name$\', full_name=\'$full_name$\', index=$index$,\n  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n  has_default_value=$has_default_value$, default_value=$default_value$,\n  message_type=None, enum_type=None, containing_type=None,\n  is_extension=$is_extension$, extension_scope=None,\n  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR,  create_key=_descriptor._internal_create_key)"
         ,0x1c7);
  io::Printer::Print(local_268->printer_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_258,local_208);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::PrintFieldDescriptor(const FieldDescriptor& field,
                                     bool is_extension) const {
  std::string options_string;
  field.options().SerializeToString(&options_string);
  std::map<std::string, std::string> m;
  m["name"] = field.name();
  m["full_name"] = field.full_name();
  m["index"] = StrCat(field.index());
  m["number"] = StrCat(field.number());
  m["type"] = StrCat(field.type());
  m["cpp_type"] = StrCat(field.cpp_type());
  m["label"] = StrCat(field.label());
  m["has_default_value"] = field.has_default_value() ? "True" : "False";
  m["default_value"] = StringifyDefaultValue(field);
  m["is_extension"] = is_extension ? "True" : "False";
  m["serialized_options"] = OptionsValue(options_string);
  m["json_name"] =
      field.has_json_name() ? ", json_name='" + field.json_name() + "'" : "";
  // We always set message_type and enum_type to None at this point, and then
  // these fields in correctly after all referenced descriptors have been
  // defined and/or imported (see FixForeignFieldsInDescriptors()).
  const char field_descriptor_decl[] =
      "_descriptor.FieldDescriptor(\n"
      "  name='$name$', full_name='$full_name$', index=$index$,\n"
      "  number=$number$, type=$type$, cpp_type=$cpp_type$, label=$label$,\n"
      "  has_default_value=$has_default_value$, "
      "default_value=$default_value$,\n"
      "  message_type=None, enum_type=None, containing_type=None,\n"
      "  is_extension=$is_extension$, extension_scope=None,\n"
      "  serialized_options=$serialized_options$$json_name$, file=DESCRIPTOR,"
      "  create_key=_descriptor._internal_create_key)";
  printer_->Print(m, field_descriptor_decl);
}